

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O0

int Agi_ManSuppSizeTest(Agi_Man_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  abctime clk;
  Agi_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  local_20 = 0;
  for (local_1c = 1; iVar1 = Agi_ManObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Agi_ObjIsNode(p,local_1c);
    if (iVar1 != 0) {
      iVar1 = Agi_ManSuppSizeOne(p,local_1c);
      local_20 = (iVar1 < 0x11) + local_20;
    }
  }
  uVar2 = Agi_ManNodeNum(p);
  printf("Nodes with small support %d (out of %d)\n",(ulong)local_20,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return local_20;
}

Assistant:

int Agi_ManSuppSizeTest( Agi_Man_t * p )
{
    abctime clk = Abc_Clock();
    int i, Counter = 0;
    Agi_ManForEachNode( p, i )
        Counter += (Agi_ManSuppSizeOne(p, i) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Agi_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;

}